

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpge.cpp
# Opt level: O1

void __thiscall jpge::jpeg_encoder::code_coefficients_pass_two(jpeg_encoder *this,int component_num)

{
  bool bVar1;
  uint uVar2;
  uint len;
  uint uVar3;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  int iVar8;
  bool bVar9;
  
  bVar9 = component_num != 0;
  iVar5 = (int)this->m_coefficient_array[0];
  iVar8 = this->m_last_dc_val[component_num];
  uVar3 = 0;
  this->m_last_dc_val[component_num] = iVar5;
  uVar6 = iVar5 - iVar8;
  if (uVar6 != 0) {
    uVar2 = -uVar6;
    if (0 < (int)uVar6) {
      uVar2 = uVar6;
    }
    uVar3 = 0;
    uVar4 = (ulong)uVar2;
    do {
      uVar3 = uVar3 + 1;
      uVar4 = uVar4 >> 1;
      bVar1 = 1 < uVar2;
      uVar2 = (uint)uVar4;
    } while (bVar1);
  }
  put_bits(this,this->m_huff_codes[bVar9][uVar3],(uint)this->m_huff_code_sizes[bVar9][uVar3]);
  if (uVar3 != 0) {
    put_bits(this,~(-1 << ((byte)uVar3 & 0x1f)) & uVar6 + (iVar5 - iVar8 >> 0x1f),uVar3);
  }
  iVar8 = 0;
  lVar7 = 1;
  do {
    uVar3 = (uint)this->m_coefficient_array[lVar7];
    if (this->m_coefficient_array[lVar7] == 0) {
      iVar8 = iVar8 + 1;
    }
    else {
      iVar5 = iVar8;
      if (0xf < iVar8) {
        do {
          put_bits(this,this->m_huff_codes[(ulong)bVar9 + 2][0xf0],
                   (uint)this->m_huff_code_sizes[(ulong)bVar9 + 2][0xf0]);
          iVar8 = iVar5 + -0x10;
          bVar1 = 0x1f < iVar5;
          iVar5 = iVar8;
        } while (bVar1);
      }
      uVar6 = -uVar3;
      if (0 < (int)uVar3) {
        uVar6 = uVar3;
      }
      uVar2 = 0x1f;
      if (uVar6 != 0) {
        for (; uVar6 >> uVar2 == 0; uVar2 = uVar2 - 1) {
        }
      }
      len = (uVar2 ^ 0xffffffe0) + 0x21;
      if (uVar6 < 2) {
        len = 1;
      }
      iVar8 = iVar8 * 0x10 + len;
      put_bits(this,this->m_huff_codes[(ulong)bVar9 + 2][iVar8],
               (uint)this->m_huff_code_sizes[(ulong)bVar9 + 2][iVar8]);
      put_bits(this,~(-1 << ((byte)len & 0x1f)) & ((int)uVar3 >> 0xf) + uVar3,len);
      iVar8 = 0;
    }
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0x40);
  if (iVar8 != 0) {
    put_bits(this,this->m_huff_codes[(ulong)bVar9 + 2][0],
             (uint)this->m_huff_code_sizes[(ulong)bVar9 + 2][0]);
    return;
  }
  return;
}

Assistant:

void jpeg_encoder::code_coefficients_pass_two(int component_num)
	{
		int i, j, run_len, nbits, temp1, temp2;
		int16* pSrc = m_coefficient_array;
		uint* codes[2];
		uint8* code_sizes[2];

		if (component_num == 0)
		{
			codes[0] = m_huff_codes[0 + 0]; codes[1] = m_huff_codes[2 + 0];
			code_sizes[0] = m_huff_code_sizes[0 + 0]; code_sizes[1] = m_huff_code_sizes[2 + 0];
		}
		else
		{
			codes[0] = m_huff_codes[0 + 1]; codes[1] = m_huff_codes[2 + 1];
			code_sizes[0] = m_huff_code_sizes[0 + 1]; code_sizes[1] = m_huff_code_sizes[2 + 1];
		}

		temp1 = temp2 = pSrc[0] - m_last_dc_val[component_num];
		m_last_dc_val[component_num] = pSrc[0];

		if (temp1 < 0)
		{
			temp1 = -temp1; temp2--;
		}

		nbits = 0;
		while (temp1)
		{
			nbits++; temp1 >>= 1;
		}

		put_bits(codes[0][nbits], code_sizes[0][nbits]);
		if (nbits) put_bits(temp2 & ((1 << nbits) - 1), nbits);

		for (run_len = 0, i = 1; i < 64; i++)
		{
			if ((temp1 = m_coefficient_array[i]) == 0)
				run_len++;
			else
			{
				while (run_len >= 16)
				{
					put_bits(codes[1][0xF0], code_sizes[1][0xF0]);
					run_len -= 16;
				}
				if ((temp2 = temp1) < 0)
				{
					temp1 = -temp1;
					temp2--;
				}
				nbits = 1;
				while (temp1 >>= 1)
					nbits++;
				j = (run_len << 4) + nbits;
				put_bits(codes[1][j], code_sizes[1][j]);
				put_bits(temp2 & ((1 << nbits) - 1), nbits);
				run_len = 0;
			}
		}
		if (run_len)
			put_bits(codes[1][0], code_sizes[1][0]);
	}